

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::path::path<char[2],ghc::filesystem::path>(path *this,char (*source) [2],format fmt)

{
  ulong uVar1;
  char *pcVar2;
  pointer pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  allocator local_39;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&local_38,*source,&local_39);
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)this,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  uVar1 = (this->_path)._M_string_length;
  if ((((uVar1 < 3) || (pcVar2 = (this->_path)._M_dataplus._M_p, *pcVar2 != '/')) ||
      (pcVar2[1] != '/')) || (pcVar2[2] == '/')) {
    pcVar3 = (this->_path)._M_dataplus._M_p;
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar3,pcVar3 + uVar1);
  }
  else {
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar2 + 2,pcVar2 + uVar1);
  }
  (this->_path)._M_string_length = (long)_Var4._M_current - (long)(this->_path)._M_dataplus._M_p;
  *_Var4._M_current = '\0';
  return;
}

Assistant:

_path(detail::toWChar(source))
#else
    : _path(detail::toUtf8(source))
#endif
{
    postprocess_path_with_format(fmt);
}